

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum.c
# Opt level: O1

int mbedtls_mpi_read_string(mbedtls_mpi *X,int radix,char *s)

{
  char cVar1;
  mbedtls_mpi *X_00;
  int iVar2;
  size_t sVar3;
  byte bVar4;
  size_t sVar5;
  ulong uVar6;
  int iVar7;
  ulong uVar8;
  ulong uVar9;
  mbedtls_mpi _B;
  mbedtls_mpi T;
  ulong local_80;
  mbedtls_mpi local_78;
  char *local_60;
  size_t local_58;
  mbedtls_mpi *local_50;
  mbedtls_mpi local_48;
  
  iVar2 = -4;
  if (0xfffffff0 < radix - 0x11U) {
    local_48.s = 1;
    local_48.n = 0;
    local_48.p = (mbedtls_mpi_uint *)0x0;
    sVar3 = strlen(s);
    if (radix == 0x10) {
      if (sVar3 >> 0x3e != 0) {
        return -4;
      }
      iVar2 = mbedtls_mpi_grow(X,((sVar3 >> 4) + 1) - (ulong)((sVar3 & 0xf) == 0));
      if ((iVar2 == 0) && (iVar2 = mbedtls_mpi_grow(X,1), iVar2 == 0)) {
        iVar2 = 0;
        memset(X->p,0,X->n << 3);
        *X->p = 0;
        X->s = 1;
        bVar4 = 0;
        uVar6 = 0;
        while( true ) {
          if (sVar3 == 1) {
            if (*s == '-') {
              X->s = -1;
              goto LAB_0010ef5c;
            }
          }
          else if (sVar3 == 0) goto LAB_0010ef5c;
          cVar1 = s[sVar3 - 1];
          iVar7 = (int)cVar1;
          uVar8 = (ulong)(iVar7 - 0x30);
          if (9 < (byte)(cVar1 - 0x30U)) {
            uVar8 = 0xff;
          }
          uVar9 = (ulong)(iVar7 - 0x37);
          if (5 < (byte)(cVar1 + 0xbfU)) {
            uVar9 = uVar8;
          }
          uVar8 = (ulong)(iVar7 - 0x57);
          if (5 < (byte)(cVar1 + 0x9fU)) {
            uVar8 = uVar9;
          }
          if (0xf < uVar8) break;
          X->p[uVar6 >> 4] = X->p[uVar6 >> 4] | uVar8 << (bVar4 & 0x3c);
          sVar3 = sVar3 - 1;
          uVar6 = uVar6 + 1;
          bVar4 = bVar4 + 4;
        }
LAB_0010f0ef:
        iVar2 = -6;
      }
    }
    else {
      iVar2 = mbedtls_mpi_grow(X,1);
      if (iVar2 == 0) {
        iVar2 = 0;
        memset(X->p,0,X->n << 3);
        *X->p = 0;
        X->s = 1;
        if (sVar3 != 0) {
          sVar5 = 0;
          local_60 = s;
          local_58 = sVar3;
          local_50 = X;
          do {
            X_00 = local_50;
            if ((sVar5 == 0) && (*s == '-')) {
              local_50->s = -1;
            }
            else {
              cVar1 = s[sVar5];
              iVar2 = (int)cVar1;
              uVar6 = (ulong)(iVar2 - 0x30);
              if (9 < (byte)(cVar1 - 0x30U)) {
                uVar6 = 0xff;
              }
              uVar8 = (ulong)(iVar2 - 0x37);
              if (5 < (byte)(cVar1 + 0xbfU)) {
                uVar8 = uVar6;
              }
              uVar6 = (ulong)(iVar2 - 0x57);
              if (5 < (byte)(cVar1 + 0x9fU)) {
                uVar6 = uVar8;
              }
              if ((uint)radix <= uVar6) goto LAB_0010f0ef;
              local_78.s = 1;
              local_78.n = 1;
              local_78.p = &local_80;
              local_80 = (ulong)(uint)radix;
              iVar2 = mbedtls_mpi_mul_mpi(&local_48,local_50,&local_78);
              if (iVar2 != 0) goto LAB_0010ef5c;
              local_80 = uVar6;
              if (X_00->s == 1) {
                local_78.s = 1;
                local_78.n = 1;
                local_78.p = &local_80;
                iVar2 = mbedtls_mpi_add_mpi(X_00,&local_48,&local_78);
              }
              else {
                local_78.s = 1;
                local_78.n = 1;
                local_78.p = &local_80;
                iVar2 = mbedtls_mpi_sub_mpi(X_00,&local_48,&local_78);
              }
              s = local_60;
              sVar3 = local_58;
              if (iVar2 != 0) goto LAB_0010ef5c;
            }
            sVar5 = sVar5 + 1;
          } while (sVar3 != sVar5);
          iVar2 = 0;
        }
      }
    }
LAB_0010ef5c:
    mbedtls_mpi_free(&local_48);
  }
  return iVar2;
}

Assistant:

int mbedtls_mpi_read_string( mbedtls_mpi *X, int radix, const char *s )
{
    int ret = MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;
    size_t i, j, slen, n;
    mbedtls_mpi_uint d;
    mbedtls_mpi T;
    MPI_VALIDATE_RET( X != NULL );
    MPI_VALIDATE_RET( s != NULL );

    if( radix < 2 || radix > 16 )
        return( MBEDTLS_ERR_MPI_BAD_INPUT_DATA );

    mbedtls_mpi_init( &T );

    slen = strlen( s );

    if( radix == 16 )
    {
        if( slen > MPI_SIZE_T_MAX >> 2 )
            return( MBEDTLS_ERR_MPI_BAD_INPUT_DATA );

        n = BITS_TO_LIMBS( slen << 2 );

        MBEDTLS_MPI_CHK( mbedtls_mpi_grow( X, n ) );
        MBEDTLS_MPI_CHK( mbedtls_mpi_lset( X, 0 ) );

        for( i = slen, j = 0; i > 0; i--, j++ )
        {
            if( i == 1 && s[i - 1] == '-' )
            {
                X->s = -1;
                break;
            }

            MBEDTLS_MPI_CHK( mpi_get_digit( &d, radix, s[i - 1] ) );
            X->p[j / ( 2 * ciL )] |= d << ( ( j % ( 2 * ciL ) ) << 2 );
        }
    }
    else
    {
        MBEDTLS_MPI_CHK( mbedtls_mpi_lset( X, 0 ) );

        for( i = 0; i < slen; i++ )
        {
            if( i == 0 && s[i] == '-' )
            {
                X->s = -1;
                continue;
            }

            MBEDTLS_MPI_CHK( mpi_get_digit( &d, radix, s[i] ) );
            MBEDTLS_MPI_CHK( mbedtls_mpi_mul_int( &T, X, radix ) );

            if( X->s == 1 )
            {
                MBEDTLS_MPI_CHK( mbedtls_mpi_add_int( X, &T, d ) );
            }
            else
            {
                MBEDTLS_MPI_CHK( mbedtls_mpi_sub_int( X, &T, d ) );
            }
        }
    }

cleanup:

    mbedtls_mpi_free( &T );

    return( ret );
}